

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

int Fra_ClauCheckClause(Cla_Man_t *p,Vec_Int_t *vClause,Vec_Int_t *vCex)

{
  sat_solver *psVar1;
  Vec_Int_t *pVVar2;
  lit lVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int local_38;
  int i;
  int iVar;
  int RetValue;
  int nBTLimit;
  Vec_Int_t *vCex_local;
  Vec_Int_t *vClause_local;
  Cla_Man_t *p_local;
  
  iVar4 = p->nSatVarsTestCur;
  p->nSatVarsTestCur = iVar4 + 1;
  lVar3 = toLit(iVar4);
  Vec_IntPush(vClause,lVar3);
  Vec_IntComplement(vClause);
  psVar1 = p->pSatTest;
  piVar5 = Vec_IntArray(vClause);
  piVar6 = Vec_IntArray(vClause);
  iVar4 = Vec_IntSize(vClause);
  iVar4 = sat_solver_addclause(psVar1,piVar5,piVar6 + iVar4);
  if (iVar4 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x1b2,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntPop(vClause);
  Vec_IntComplement(vClause);
  Fra_ClauRemapClause(p->pMapCsTestToNsTest,vClause,p->vCexAssm,0);
  for (local_38 = p->nSatVarsTestBeg; local_38 < p->nSatVarsTestCur + -1; local_38 = local_38 + 1) {
    pVVar2 = p->vCexAssm;
    lVar3 = toLitCond(local_38,1);
    Vec_IntPush(pVVar2,lVar3);
  }
  pVVar2 = p->vCexAssm;
  lVar3 = toLitCond(local_38,0);
  Vec_IntPush(pVVar2,lVar3);
  psVar1 = p->pSatTest;
  piVar5 = Vec_IntArray(p->vCexAssm);
  piVar6 = Vec_IntArray(p->vCexAssm);
  iVar4 = Vec_IntSize(p->vCexAssm);
  iVar4 = sat_solver_solve(psVar1,piVar5,piVar6 + iVar4,0,0,0,0);
  if (vCex != (Vec_Int_t *)0x0) {
    Vec_IntClear(vCex);
  }
  if (iVar4 == -1) {
    p_local._4_4_ = 1;
  }
  else {
    if (iVar4 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                    ,0x1c3,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (vCex != (Vec_Int_t *)0x0) {
      for (local_38 = 0; iVar4 = Vec_IntSize(p->vSatVarsTestCs), local_38 < iVar4;
          local_38 = local_38 + 1) {
        iVar4 = Vec_IntEntry(p->vSatVarsTestCs,local_38);
        iVar4 = sat_solver_var_literal(p->pSatTest,iVar4);
        Vec_IntPush(vCex,iVar4);
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClauCheckClause( Cla_Man_t * p, Vec_Int_t * vClause, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    // complement literals
    Vec_IntPush( vClause, toLit( p->nSatVarsTestCur++ ) ); // helper positive
    Vec_IntComplement( vClause ); // helper negative (the clause is C v h')
    // add the clause
    RetValue = sat_solver_addclause( p->pSatTest, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
    assert( RetValue == 1 );
    // complement all literals
    Vec_IntPop( vClause );  // helper removed
    Vec_IntComplement( vClause ); 
    // create the assumption in terms of NS variables
    Fra_ClauRemapClause( p->pMapCsTestToNsTest, vClause, p->vCexAssm, 0 );
    // add helper literals
    for ( i = p->nSatVarsTestBeg; i < p->nSatVarsTestCur - 1; i++ )
        Vec_IntPush( p->vCexAssm, toLitCond(i,1) ); // other helpers negative
    Vec_IntPush( p->vCexAssm, toLitCond(i,0) ); // positive helper
    // try to solve
    RetValue = sat_solver_solve( p->pSatTest, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm), 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( vCex )
        Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    if ( vCex )
    {
        Vec_IntForEachEntry( p->vSatVarsTestCs, iVar, i )
            Vec_IntPush( vCex, sat_solver_var_literal(p->pSatTest, iVar) );
    }
    return 0;
}